

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_equals(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint uVar1;
  void **ppvVar2;
  uint8_t *puVar3;
  void **ppvVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  array_container_t *container1;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  size_t n;
  array_container_t *container1_00;
  uint64_t *s2;
  array_container_t *paVar10;
  uint64_t *s1;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  
  uVar1 = (r1->high_low_container).size;
  uVar11 = (ulong)uVar1;
  if (uVar1 == (r2->high_low_container).size) {
    if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        if ((r1->high_low_container).keys[uVar9] != (r2->high_low_container).keys[uVar9])
        goto LAB_0011b2d4;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    bVar12 = (int)uVar1 < 1;
    if (0 < (int)uVar1) {
      ppvVar2 = (r1->high_low_container).containers;
      puVar3 = (r1->high_low_container).typecodes;
      ppvVar4 = (r2->high_low_container).containers;
      puVar5 = (r2->high_low_container).typecodes;
      uVar9 = 1;
      do {
        container1 = (array_container_t *)ppvVar2[uVar9 - 1];
        bVar7 = puVar3[uVar9 - 1];
        container1_00 = (array_container_t *)ppvVar4[uVar9 - 1];
        bVar8 = puVar5[uVar9 - 1];
        if (bVar7 == 4) {
          bVar7 = *(byte *)&container1->array;
          if (bVar7 == 4) goto LAB_0011b2ea;
          container1 = *(array_container_t **)container1;
        }
        if (bVar8 == 4) {
          bVar8 = *(byte *)&container1_00->array;
          if (bVar8 == 4) {
LAB_0011b2ea:
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          container1_00 = *(array_container_t **)container1_00;
        }
        switch((uint)bVar8 + (uint)bVar7 * 4) {
        case 5:
          _Var6 = bitset_container_equals
                            ((bitset_container_t *)container1,(bitset_container_t *)container1_00);
          goto LAB_0011b2b4;
        case 6:
          paVar10 = container1;
          break;
        case 7:
          paVar10 = container1;
          goto LAB_0011b2af;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x12a0,
                        "_Bool container_equals(const container_t *, uint8_t, const container_t *, uint8_t)"
                       );
        case 9:
          paVar10 = container1_00;
          container1_00 = container1;
          break;
        case 10:
          if (container1->cardinality != container1_00->cardinality) {
            return bVar12;
          }
          s1 = (uint64_t *)container1->array;
          s2 = (uint64_t *)container1_00->array;
          n = (long)container1->cardinality * 2;
          goto LAB_0011b279;
        case 0xb:
          paVar10 = container1;
          goto LAB_0011b293;
        case 0xd:
          paVar10 = container1_00;
          container1_00 = container1;
LAB_0011b2af:
          _Var6 = run_container_equals_bitset
                            ((run_container_t *)container1_00,(bitset_container_t *)paVar10);
          goto LAB_0011b2b4;
        case 0xe:
          paVar10 = container1_00;
          container1_00 = container1;
LAB_0011b293:
          _Var6 = run_container_equals_array((run_container_t *)container1_00,paVar10);
          goto LAB_0011b2b4;
        case 0xf:
          if (container1->cardinality != container1_00->cardinality) {
            return bVar12;
          }
          s1 = (uint64_t *)container1->array;
          s2 = (uint64_t *)container1_00->array;
          n = (long)container1->cardinality << 2;
LAB_0011b279:
          _Var6 = memequals(s1,s2,n);
          goto LAB_0011b2b4;
        }
        _Var6 = array_container_equal_bitset(container1_00,(bitset_container_t *)paVar10);
LAB_0011b2b4:
        if (_Var6 == false) {
          return bVar12;
        }
        bVar12 = uVar11 <= uVar9;
        bVar13 = uVar9 != uVar11;
        uVar9 = uVar9 + 1;
      } while (bVar13);
    }
  }
  else {
LAB_0011b2d4:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool roaring_bitmap_equals(const roaring_bitmap_t *r1,
                           const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    if (ra1->size != ra2->size) {
        return false;
    }
    for (int i = 0; i < ra1->size; ++i) {
        if (ra1->keys[i] != ra2->keys[i]) {
            return false;
        }
    }
    for (int i = 0; i < ra1->size; ++i) {
        bool areequal = container_equals(ra1->containers[i],
                                         ra1->typecodes[i],
                                         ra2->containers[i],
                                         ra2->typecodes[i]);
        if (!areequal) {
            return false;
        }
    }
    return true;
}